

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obme.cpp
# Opt level: O1

char * obme::OBME_D(char *data,int length)

{
  byte bVar1;
  long lVar2;
  
  if (1 < length) {
    lVar2 = (ulong)(uint)length + 1;
    do {
      bVar1 = data[lVar2 + -2];
      if (_OBME_MASK == (byte *)0x0) {
        obme_init();
      }
      data[lVar2 + -2] = bVar1 ^ *_OBME_MASK;
      lVar2 = lVar2 + -1;
    } while (2 < lVar2);
  }
  return data;
}

Assistant:

char* OBME_D(char *data, int length)
	{
		while(length > 1) {
			--length;
			data[length] = OBME(data[length]);
		}
		return data;
	}